

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O0

void __thiscall
shared_data::print_update
          (shared_data *this,bool holdout_set_off,size_t current_pass,float label,float prediction,
          size_t num_features,bool progress_add,float progress_arg)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  _Setprecision _Var3;
  ostream *poVar4;
  void *pvVar5;
  undefined8 uVar6;
  byte in_SIL;
  byte in_R8B;
  float in_XMM0_Da;
  float in_XMM1_Da;
  ostringstream pred_buf;
  ostringstream label_buf;
  string local_388 [24];
  float in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc97;
  size_t in_stack_fffffffffffffc98;
  string *in_stack_fffffffffffffca0;
  string *in_stack_fffffffffffffca8;
  size_t in_stack_fffffffffffffcb0;
  ostream local_320;
  ostream local_1a8;
  byte local_29;
  float local_20;
  float local_1c;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_29 = in_R8B & 1;
  local_20 = in_XMM1_Da;
  local_1c = in_XMM0_Da;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
  _Var2 = std::setw(8);
  poVar4 = std::operator<<(&local_1a8,_Var2);
  _Var1 = std::setfill<char>(' ');
  std::operator<<(poVar4,_Var1._M_c);
  if (3.4028235e+38 <= local_1c) {
    poVar4 = (ostream *)std::ostream::operator<<(&local_1a8,std::left);
    std::operator<<(poVar4," unknown");
  }
  else {
    _Var3 = std::setprecision(4);
    poVar4 = std::operator<<(&local_1a8,_Var3);
    pvVar5 = (void *)std::ostream::operator<<(poVar4,std::fixed);
    pvVar5 = (void *)std::ostream::operator<<(pvVar5,std::right);
    std::ostream::operator<<(pvVar5,local_1c);
  }
  _Var2 = std::setw(8);
  poVar4 = std::operator<<(&local_320,_Var2);
  _Var3 = std::setprecision(4);
  poVar4 = std::operator<<(poVar4,_Var3);
  pvVar5 = (void *)std::ostream::operator<<(poVar4,std::fixed);
  uVar6 = std::ostream::operator<<(pvVar5,std::right);
  _Var1 = std::setfill<char>(' ');
  poVar4 = std::operator<<(uVar6,_Var1._M_c);
  std::ostream::operator<<(poVar4,local_20);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  print_update((shared_data *)CONCAT44(_Var2._M_n,_Var3._M_n),(bool)_Var1._M_c,
               in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
               in_stack_fffffffffffffc98,(bool)in_stack_fffffffffffffc97,in_stack_fffffffffffffc90);
  std::__cxx11::string::~string(local_388);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc98);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  return;
}

Assistant:

void print_update(bool holdout_set_off, size_t current_pass, float label, float prediction, size_t num_features,
      bool progress_add, float progress_arg)
  {
    std::ostringstream label_buf, pred_buf;

    label_buf << std::setw(col_current_label) << std::setfill(' ');
    if (label < FLT_MAX)
      label_buf << std::setprecision(prec_current_label) << std::fixed << std::right << label;
    else
      label_buf << std::left << " unknown";

    pred_buf << std::setw(col_current_predict) << std::setprecision(prec_current_predict) << std::fixed << std::right
             << std::setfill(' ') << prediction;

    print_update(
        holdout_set_off, current_pass, label_buf.str(), pred_buf.str(), num_features, progress_add, progress_arg);
  }